

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleConfigureCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  ostream *poVar4;
  bool escapeQuotes;
  pointer pbVar5;
  bool atOnly;
  ulong uVar6;
  string local_1c8;
  string output;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar3 - (long)pbVar5) < 0x21) {
    std::__cxx11::string::string
              ((string *)&output,"No input string specified.",(allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,&output);
  }
  else {
    if ((long)pbVar3 - (long)pbVar5 != 0x40) {
      uVar6 = 3;
      escapeQuotes = false;
      atOnly = false;
      do {
        if ((ulong)((long)pbVar3 - (long)pbVar5 >> 5) <= uVar6) {
          output._M_dataplus._M_p = (pointer)&output.field_2;
          output._M_string_length = 0;
          output.field_2._M_local_buf[0] = '\0';
          cmMakefile::ConfigureString
                    ((this->super_cmCommand).Makefile,pbVar5 + 1,&output,atOnly,escapeQuotes);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 2,output._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&output);
          return true;
        }
        bVar2 = std::operator==(pbVar5 + uVar6,"@ONLY");
        bVar1 = true;
        if (!bVar2) {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar6,"ESCAPE_QUOTES"
                                 );
          escapeQuotes = true;
          bVar1 = atOnly;
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
            poVar4 = std::operator<<((ostream *)&output,"Unrecognized argument \"");
            poVar4 = std::operator<<(poVar4,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + uVar6));
            std::operator<<(poVar4,"\"");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
            return false;
          }
        }
        atOnly = bVar1;
        uVar6 = (ulong)((int)uVar6 + 1);
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    std::__cxx11::string::string
              ((string *)&output,"No output variable specified.",(allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,&output);
  }
  std::__cxx11::string::~string((string *)&output);
  return false;
}

Assistant:

bool cmStringCommand::HandleConfigureCommand(
  std::vector<std::string> const& args)
{
  if ( args.size() < 2 )
    {
    this->SetError("No input string specified.");
    return false;
    }
  else if ( args.size() < 3 )
    {
    this->SetError("No output variable specified.");
    return false;
    }

  // Parse options.
  bool escapeQuotes = false;
  bool atOnly = false;
  for(unsigned int i = 3; i < args.size(); ++i)
    {
    if(args[i] == "@ONLY")
      {
      atOnly = true;
      }
    else if(args[i] == "ESCAPE_QUOTES")
      {
      escapeQuotes = true;
      }
    else
      {
      std::ostringstream err;
      err << "Unrecognized argument \"" << args[i] << "\"";
      this->SetError(err.str());
      return false;
      }
    }

  // Configure the string.
  std::string output;
  this->Makefile->ConfigureString(args[1], output, atOnly, escapeQuotes);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(args[2], output.c_str());

  return true;
}